

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

void __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::initializeTableContents
          (ModuleRunnerBase<wasm::ModuleRunner> *this)

{
  Type *pTVar1;
  pointer puVar2;
  long *plVar3;
  pointer puVar4;
  ElementSegment *segment_00;
  HeapType type;
  ulong uVar5;
  unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *table;
  pointer puVar6;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *segment;
  pointer puVar7;
  undefined1 local_70 [8];
  Const zero;
  Literal null;
  
  puVar6 = (this->wasm->tables).
           super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->wasm->tables).
           super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar6 != puVar2) {
    pTVar1 = &zero.value.type;
    do {
      uVar5 = (((puVar6->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>
                ._M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->type).id;
      if (((uint)uVar5 & 3) == 2 && 6 < uVar5) {
        getTableInstanceInfo
                  ((TableInstanceInfo *)local_70,this,
                   (IString)*(IString *)
                             &(((puVar6->_M_t).
                                super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>
                                .super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->
                              super_Importable).super_Named);
        type = Type::getHeapType(&((puVar6->_M_t).
                                   super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>
                                   .super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->type)
        ;
        Literal::makeNull((Literal *)pTVar1,type);
        if ((((puVar6->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
              _M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
              super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->initial).addr != 0) {
          uVar5 = 0;
          do {
            plVar3 = *(long **)(CONCAT71(local_70._1_7_,local_70[0]) + 0x200);
            (**(code **)(*plVar3 + 0xe0))
                      (plVar3,zero.super_SpecificExpression<(wasm::Expression::Id)14>.
                              super_Expression._0_8_,
                       zero.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type
                       .id,uVar5,pTVar1);
            uVar5 = uVar5 + 1;
          } while (uVar5 < (((puVar6->_M_t).
                             super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
                             _M_t.
                             super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>
                             .super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->initial).
                           addr);
        }
        ::wasm::Literal::~Literal((Literal *)pTVar1);
      }
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar2);
  }
  pTVar1 = &zero.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type;
  local_70[0] = 0xe;
  zero.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._id = InvalidId;
  zero.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression._1_7_ = 0;
  zero.super_SpecificExpression<(wasm::Expression::Id)14>.super_Expression.type.id = 0;
  zero.value.field_0.i64 = 0;
  zero.value.field_0.func.super_IString.str._M_str = (char *)0x0;
  zero.value.type.id = (ulong)zero.value.type.id._4_4_ << 0x20;
  ::wasm::Literal::operator=((Literal *)pTVar1,(Literal *)&zero.value.type);
  ::wasm::Literal::~Literal((Literal *)&zero.value.type);
  ::wasm::Const::finalize();
  puVar7 = (this->wasm->elementSegments).
           super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar4 = (this->wasm->elementSegments).
           super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  zero.value.type.id = (uintptr_t)local_70;
  if (puVar7 != puVar4) {
    do {
      segment_00 = (puVar7->_M_t).
                   super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                   .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
      if (*(char **)((long)&(segment_00->table).super_IString + 8) != (char *)0x0) {
        initializeTableContents::anon_class_16_2_4039898f::operator()
                  ((anon_class_16_2_4039898f *)&zero.value.type,segment_00);
      }
      puVar7 = puVar7 + 1;
    } while (puVar7 != puVar4);
  }
  ::wasm::Literal::~Literal((Literal *)pTVar1);
  return;
}

Assistant:

void initializeTableContents() {
    for (auto& table : wasm.tables) {
      if (table->type.isNullable()) {
        // Initial with nulls in a nullable table.
        auto info = getTableInstanceInfo(table->name);
        auto null = Literal::makeNull(table->type.getHeapType());
        for (Address i = 0; i < table->initial; i++) {
          info.interface()->tableStore(info.name, i, null);
        }
      }
    }

    Const zero;
    zero.value = Literal(uint32_t(0));
    zero.finalize();

    ModuleUtils::iterActiveElementSegments(wasm, [&](ElementSegment* segment) {
      Const size;
      size.value = Literal(uint32_t(segment->data.size()));
      size.finalize();

      TableInit init;
      init.table = segment->table;
      init.segment = segment->name;
      init.dest = segment->offset;
      init.offset = &zero;
      init.size = &size;
      init.finalize();

      self()->visit(&init);

      droppedElementSegments.insert(segment->name);
    });
  }